

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_iq2_xxs_q8_K
               (int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ulong uVar3;
  ulong uVar4;
  __m256 x_00;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 (*pauVar10) [32];
  long in_RCX;
  float *in_RSI;
  int in_EDI;
  long in_R9;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  __m256i p2;
  __m256i p1;
  uint16_t ls2;
  uint16_t ls1;
  __m256i dot2;
  __m256i dot1;
  __m256i q8s_2;
  __m256i q8s_1;
  __m256i s2_2;
  __m256i s2_1;
  __m256i q2_2;
  __m256i q2_1;
  __m256i q8_2;
  __m256i q8_1;
  int ib32;
  __m256i sumi2;
  __m256i sumi1;
  int8_t *q8;
  uint16_t *q2;
  float d;
  int i;
  __m256 accumf;
  uint8_t *aux8;
  uint32_t aux32 [4];
  uint64_t *signs64;
  int nb;
  block_q8_K *y;
  block_iq2_xxs *x;
  undefined4 in_stack_fffffffffffff7b8;
  ushort in_stack_fffffffffffff7bc;
  ushort in_stack_fffffffffffff7be;
  undefined8 in_stack_fffffffffffff7c0;
  undefined8 in_stack_fffffffffffff7c8;
  undefined8 in_stack_fffffffffffff7d0;
  int local_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 (*local_638) [32];
  ulong *local_630;
  int local_624;
  undefined1 local_620 [32];
  uint uStack_5dc;
  uint uStack_5d4;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0xff;
  }
  local_620._0_16_ = ZEXT816(0);
  local_624 = 0;
  while( true ) {
    local_620 = ZEXT1632(local_620._0_16_);
    if (in_EDI >> 8 <= local_624) break;
    fVar11 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + (long)local_624 * 0x42));
    fVar11 = fVar11 * *(float *)(in_R9 + (long)local_624 * 0x124);
    local_630 = (ulong *)(in_RCX + 2 + (long)local_624 * 0x42);
    local_638 = (undefined1 (*) [32])(in_R9 + 4 + (long)local_624 * 0x124);
    local_660 = ZEXT1632(ZEXT816(0));
    local_680 = ZEXT1632(ZEXT816(0));
    local_684 = 0;
    while( true ) {
      if (7 < local_684) break;
      auVar2 = *local_638;
      pauVar10 = local_638 + 1;
      local_638 = local_638 + 2;
      uVar3 = *local_630;
      uVar4 = local_630[1];
      local_630 = local_630 + 2;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = iq2xxs_grid[uVar3 & 0xff];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = iq2xxs_grid[uVar3 >> 8 & 0xff];
      auVar12 = vpunpcklqdq_avx(auVar12,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = iq2xxs_grid[uVar3 >> 0x10 & 0xff];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = iq2xxs_grid[uVar3 >> 0x18 & 0xff];
      auVar13 = vpunpcklqdq_avx(auVar17,auVar24);
      uStack_130 = auVar13._0_8_;
      uStack_128 = auVar13._8_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = iq2xxs_grid[uVar4 & 0xff];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = iq2xxs_grid[uVar4 >> 8 & 0xff];
      auVar13 = vpunpcklqdq_avx(auVar13,auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = iq2xxs_grid[uVar4 >> 0x10 & 0xff];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = iq2xxs_grid[uVar4 >> 0x18 & 0xff];
      auVar15 = vpunpcklqdq_avx(auVar19,auVar25);
      uStack_170 = auVar15._0_8_;
      uStack_168 = auVar15._8_8_;
      uStack_5dc = (uint)(uVar3 >> 0x20);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5dc & 0x7f) * 8);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5dc >> 7 & 0x7f) * 8);
      auVar15 = vpunpcklqdq_avx(auVar15,auVar20);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5dc >> 0xe & 0x7f) * 8);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5dc >> 0x15 & 0x7f) * 8);
      auVar14 = vpunpcklqdq_avx(auVar21,auVar26);
      uStack_1b0 = auVar14._0_8_;
      uStack_1a8 = auVar14._8_8_;
      uStack_5d4 = (uint)(uVar4 >> 0x20);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5d4 & 0x7f) * 8);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5d4 >> 7 & 0x7f) * 8);
      auVar14 = vpunpcklqdq_avx(auVar14,auVar22);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5d4 >> 0xe & 0x7f) * 8);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5d4 >> 0x15 & 0x7f) * 8);
      auVar16 = vpunpcklqdq_avx(auVar23,auVar27);
      uStack_1f0 = auVar16._0_8_;
      uStack_1e8 = auVar16._8_8_;
      auVar1._16_8_ = uStack_1b0;
      auVar1._0_16_ = auVar15;
      auVar1._24_8_ = uStack_1a8;
      auVar1 = vpsignb_avx2(auVar2,auVar1);
      auVar2._16_8_ = uStack_1f0;
      auVar2._0_16_ = auVar14;
      auVar2._24_8_ = uStack_1e8;
      auVar2 = vpsignb_avx2(*pauVar10,auVar2);
      auVar7._16_8_ = uStack_130;
      auVar7._0_16_ = auVar12;
      auVar7._24_8_ = uStack_128;
      auVar1 = vpmaddubsw_avx2(auVar7,auVar1);
      auVar6._16_8_ = uStack_170;
      auVar6._0_16_ = auVar13;
      auVar6._24_8_ = uStack_168;
      auVar2 = vpmaddubsw_avx2(auVar6,auVar2);
      in_stack_fffffffffffff7bc = (ushort)(uVar3 >> 0x3c) * 2 + 1;
      auVar12 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff7bc),(uint)in_stack_fffffffffffff7bc,1);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7bc,2);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7bc,3);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7bc,4);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7bc,5);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7bc,6);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7bc,7);
      auVar13 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff7bc),(uint)in_stack_fffffffffffff7bc,1);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7bc,2);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7bc,3);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7bc,4);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7bc,5);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7bc,6);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7bc,7);
      uStack_2d0 = auVar13._0_8_;
      uStack_2c8 = auVar13._8_8_;
      auVar9._16_8_ = uStack_2d0;
      auVar9._0_16_ = auVar12;
      auVar9._24_8_ = uStack_2c8;
      auVar1 = vpmaddwd_avx2(auVar1,auVar9);
      in_stack_fffffffffffff7be = (ushort)(uVar4 >> 0x3c) * 2 + 1;
      auVar12 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff7be),(uint)in_stack_fffffffffffff7be,1);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7be,2);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7be,3);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7be,4);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7be,5);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7be,6);
      auVar12 = vpinsrw_avx(auVar12,(uint)in_stack_fffffffffffff7be,7);
      auVar13 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff7be),(uint)in_stack_fffffffffffff7be,1);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7be,2);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7be,3);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7be,4);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7be,5);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7be,6);
      auVar13 = vpinsrw_avx(auVar13,(uint)in_stack_fffffffffffff7be,7);
      auVar15 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar12;
      uStack_330 = auVar15._0_8_;
      uStack_328 = auVar15._8_8_;
      auVar8._16_8_ = uStack_330;
      auVar8._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar13;
      auVar8._24_8_ = uStack_328;
      auVar2 = vpmaddwd_avx2(auVar2,auVar8);
      in_stack_fffffffffffff7c0 = auVar2._0_8_;
      in_stack_fffffffffffff7c8 = auVar2._8_8_;
      in_stack_fffffffffffff7d0 = auVar2._16_8_;
      local_660 = vpaddd_avx2(local_660,auVar1);
      local_680 = vpaddd_avx2(local_680,auVar2);
      local_684 = local_684 + 2;
    }
    auVar12 = vinsertps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),0x10);
    auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar11),0x20);
    auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar11),0x30);
    auVar13 = vinsertps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar11),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar11),0x30);
    uStack_70 = auVar12._0_8_;
    uStack_68 = auVar12._8_8_;
    auVar1 = vpaddd_avx2(local_660,local_680);
    auVar1 = vcvtdq2ps_avx(auVar1);
    auVar5._16_8_ = uStack_70;
    auVar5._0_16_ = auVar13;
    auVar5._24_8_ = uStack_68;
    local_620._0_16_ = vfmadd213ps_fma(auVar1,auVar5,local_620);
    local_624 = local_624 + 1;
  }
  x_00[1]._0_2_ = in_stack_fffffffffffff7bc;
  x_00[0] = (float)in_stack_fffffffffffff7b8;
  x_00[1]._2_2_ = in_stack_fffffffffffff7be;
  x_00[2] = (float)(int)in_stack_fffffffffffff7c0;
  x_00[3] = (float)(int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
  x_00[4] = (float)(int)in_stack_fffffffffffff7c8;
  x_00[5] = (float)(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
  x_00[6] = (float)(int)in_stack_fffffffffffff7d0;
  x_00[7] = (float)(int)((ulong)in_stack_fffffffffffff7d0 >> 0x20);
  fVar11 = hsum_float_8(x_00);
  *in_RSI = fVar11 * 0.125;
  return;
}

Assistant:

void ggml_vec_dot_iq2_xxs_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(n % QK_K == 0);
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_iq2_xxs * GGML_RESTRICT x = vx;
    const block_q8_K    * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined(__ARM_NEON)

    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    uint32_t aux32[4];
    const uint8_t * aux8 = (const uint8_t *)aux32;

    ggml_int8x16x4_t q2u;
    ggml_int8x16x4_t q2s;
    ggml_int8x16x4_t q8b;

    float sumf = 0;
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint16_t * GGML_RESTRICT q2 = x[i].qs;
        const int8_t   * GGML_RESTRICT q8 = y[i].qs;
        float sumf1 = 0, sumf2 = 0;
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            q8b = ggml_vld1q_s8_x4(q8); q8 += 64;
            memcpy(aux32, q2, 4*sizeof(uint32_t)); q2 += 8;
            q2u.val[0] = vcombine_s8(vld1_s8((const void *)(iq2xxs_grid + aux8[ 0])), vld1_s8((const void *)(iq2xxs_grid + aux8[ 1])));
            q2u.val[1] = vcombine_s8(vld1_s8((const void *)(iq2xxs_grid + aux8[ 2])), vld1_s8((const void *)(iq2xxs_grid + aux8[ 3])));
            q2u.val[2] = vcombine_s8(vld1_s8((const void *)(iq2xxs_grid + aux8[ 8])), vld1_s8((const void *)(iq2xxs_grid + aux8[ 9])));
            q2u.val[3] = vcombine_s8(vld1_s8((const void *)(iq2xxs_grid + aux8[10])), vld1_s8((const void *)(iq2xxs_grid + aux8[11])));
            q2s.val[0] = vcombine_s8(vld1_s8((const void *)(signs64 + ((aux32[1] >>  0) & 127))), vld1_s8((const void *)(signs64 + ((aux32[1] >>  7) & 127))));
            q2s.val[1] = vcombine_s8(vld1_s8((const void *)(signs64 + ((aux32[1] >> 14) & 127))), vld1_s8((const void *)(signs64 + ((aux32[1] >> 21) & 127))));
            q2s.val[2] = vcombine_s8(vld1_s8((const void *)(signs64 + ((aux32[3] >>  0) & 127))), vld1_s8((const void *)(signs64 + ((aux32[3] >>  7) & 127))));
            q2s.val[3] = vcombine_s8(vld1_s8((const void *)(signs64 + ((aux32[3] >> 14) & 127))), vld1_s8((const void *)(signs64 + ((aux32[3] >> 21) & 127))));
            q2u.val[0] = vmulq_s8(q2u.val[0], q2s.val[0]);
            q2u.val[1] = vmulq_s8(q2u.val[1], q2s.val[1]);
            q2u.val[2] = vmulq_s8(q2u.val[2], q2s.val[2]);
            q2u.val[3] = vmulq_s8(q2u.val[3], q2s.val[3]);
            const int32x4_t p1 = ggml_vdotq_s32(ggml_vdotq_s32(vdupq_n_s32(0), q2u.val[0], q8b.val[0]), q2u.val[1], q8b.val[1]);
            const int32x4_t p2 = ggml_vdotq_s32(ggml_vdotq_s32(vdupq_n_s32(0), q2u.val[2], q8b.val[2]), q2u.val[3], q8b.val[3]);
            sumf1 += vaddvq_s32(p1) * (0.5f + (aux32[1] >> 28));
            sumf2 += vaddvq_s32(p2) * (0.5f + (aux32[3] >> 28));
        }
        sumf += d*(sumf1 + sumf2);
    }
    *s = 0.25f * sumf;

#elif defined(__AVX2__)

    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    uint32_t aux32[4];
    const uint8_t * aux8 = (const uint8_t *)aux32;

    __m256 accumf = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint16_t * GGML_RESTRICT q2 = x[i].qs;
        const int8_t   * GGML_RESTRICT q8 = y[i].qs;
        __m256i sumi1 = _mm256_setzero_si256();
        __m256i sumi2 = _mm256_setzero_si256();
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m256i q8_1 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            const __m256i q8_2 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            memcpy(aux32, q2, 4*sizeof(uint32_t)); q2 += 8;
            const __m256i q2_1 = _mm256_set_epi64x(iq2xxs_grid[aux8[ 3]], iq2xxs_grid[aux8[ 2]], iq2xxs_grid[aux8[1]], iq2xxs_grid[aux8[0]]);
            const __m256i q2_2 = _mm256_set_epi64x(iq2xxs_grid[aux8[11]], iq2xxs_grid[aux8[10]], iq2xxs_grid[aux8[9]], iq2xxs_grid[aux8[8]]);
            const __m256i s2_1 = _mm256_set_epi64x(signs64[(aux32[1] >> 21) & 127], signs64[(aux32[1] >> 14) & 127],
                                                   signs64[(aux32[1] >>  7) & 127], signs64[(aux32[1] >>  0) & 127]);
            const __m256i s2_2 = _mm256_set_epi64x(signs64[(aux32[3] >> 21) & 127], signs64[(aux32[3] >> 14) & 127],
                                                   signs64[(aux32[3] >>  7) & 127], signs64[(aux32[3] >>  0) & 127]);
            const __m256i q8s_1 = _mm256_sign_epi8(q8_1, s2_1);
            const __m256i q8s_2 = _mm256_sign_epi8(q8_2, s2_2);
            const __m256i dot1  = _mm256_maddubs_epi16(q2_1, q8s_1);
            const __m256i dot2  = _mm256_maddubs_epi16(q2_2, q8s_2);
            const uint16_t ls1 = aux32[1] >> 28;
            const uint16_t ls2 = aux32[3] >> 28;
            const __m256i p1 = _mm256_madd_epi16(dot1, _mm256_set1_epi16(2*ls1+1));
            const __m256i p2 = _mm256_madd_epi16(dot2, _mm256_set1_epi16(2*ls2+1));
            sumi1 = _mm256_add_epi32(sumi1, p1);
            sumi2 = _mm256_add_epi32(sumi2, p2);
        }

        accumf = _mm256_fmadd_ps(_mm256_set1_ps(d), _mm256_cvtepi32_ps(_mm256_add_epi32(sumi1, sumi2)), accumf);

    }

    *s = 0.125f * hsum_float_8(accumf);

#elif defined(__AVX__)
    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    uint32_t aux32[4];
    const uint8_t * aux8 = (const uint8_t *)aux32;

    __m256 accumf = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint16_t * GGML_RESTRICT q2 = x[i].qs;
        const int8_t   * GGML_RESTRICT q8 = y[i].qs;
        __m128i sumi1_0 = _mm_setzero_si128();
        __m128i sumi1_1 = _mm_setzero_si128();
        __m128i sumi2_0 = _mm_setzero_si128();
        __m128i sumi2_1 = _mm_setzero_si128();
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m128i q8_1_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_1_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_2_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_2_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            memcpy(aux32, q2, 4*sizeof(uint32_t)); q2 += 8;
            const __m128i q2_1_0 = _mm_set_epi64x(iq2xxs_grid[aux8[1]], iq2xxs_grid[aux8[0]]);
            const __m128i q2_1_1 = _mm_set_epi64x(iq2xxs_grid[aux8[3]], iq2xxs_grid[aux8[2]]);
            const __m128i q2_2_0 = _mm_set_epi64x(iq2xxs_grid[aux8[9]], iq2xxs_grid[aux8[8]]);
            const __m128i q2_2_1 = _mm_set_epi64x(iq2xxs_grid[aux8[11]], iq2xxs_grid[aux8[10]]);
            const __m128i s2_1_0 = _mm_set_epi64x(signs64[(aux32[1] >>  7) & 127], signs64[(aux32[1] >>  0) & 127]);
            const __m128i s2_1_1 = _mm_set_epi64x(signs64[(aux32[1] >> 21) & 127], signs64[(aux32[1] >> 14) & 127]);
            const __m128i s2_2_0 = _mm_set_epi64x(signs64[(aux32[3] >>  7) & 127], signs64[(aux32[3] >>  0) & 127]);
            const __m128i s2_2_1 = _mm_set_epi64x(signs64[(aux32[3] >> 21) & 127], signs64[(aux32[3] >> 14) & 127]);
            const __m128i q8s_1_0 = _mm_sign_epi8(q8_1_0, s2_1_0);
            const __m128i q8s_1_1 = _mm_sign_epi8(q8_1_1, s2_1_1);
            const __m128i q8s_2_0 = _mm_sign_epi8(q8_2_0, s2_2_0);
            const __m128i q8s_2_1 = _mm_sign_epi8(q8_2_1, s2_2_1);
            const __m128i dot1_0  = _mm_maddubs_epi16(q2_1_0, q8s_1_0);
            const __m128i dot1_1  = _mm_maddubs_epi16(q2_1_1, q8s_1_1);
            const __m128i dot2_0  = _mm_maddubs_epi16(q2_2_0, q8s_2_0);
            const __m128i dot2_1  = _mm_maddubs_epi16(q2_2_1, q8s_2_1);
            const uint16_t ls1 = aux32[1] >> 28;
            const uint16_t ls2 = aux32[3] >> 28;
            const __m128i p1_0 = _mm_madd_epi16(dot1_0, _mm_set1_epi16(2*ls1+1));
            const __m128i p1_1 = _mm_madd_epi16(dot1_1, _mm_set1_epi16(2*ls1+1));
            const __m128i p2_0 = _mm_madd_epi16(dot2_0, _mm_set1_epi16(2*ls2+1));
            const __m128i p2_1 = _mm_madd_epi16(dot2_1, _mm_set1_epi16(2*ls2+1));
            sumi1_0 = _mm_add_epi32(sumi1_0, p1_0);
            sumi1_1 = _mm_add_epi32(sumi1_1, p1_1);
            sumi2_0 = _mm_add_epi32(sumi2_0, p2_0);
            sumi2_1 = _mm_add_epi32(sumi2_1, p2_1);
        }

        accumf = _mm256_add_ps(_mm256_mul_ps(_mm256_set1_ps(d), _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_add_epi32(sumi1_1, sumi2_1), _mm_add_epi32(sumi1_0, sumi2_0)))), accumf);

    }

    *s = 0.125f * hsum_float_8(accumf);

#elif defined(__POWER9_VECTOR__)
    const vector int v0 = vec_splats((int32_t)0);
    vector float vsumf0 = vec_splats(0.0f);
    vector float vsumf1 = vec_splats(0.0f);
    vector float vsumf2 = vec_splats(0.0f);
    vector float vsumf3 = vec_splats(0.0f);

    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    for (int i = 0; i < nb; ++i) {
        vector float vxd = vec_splats(GGML_FP16_TO_FP32(x[i].d));
        vector float vyd = vec_splats(y[i].d);
        vector float vd = vec_mul(vxd, vyd);

        vector signed int vsumi0 = v0;
        vector signed int vsumi1 = v0;
        vector signed int vsumi2 = v0;
        vector signed int vsumi3 = v0;

        const uint16_t * GGML_RESTRICT q2 = x[i].qs;
        const int8_t  *  GGML_RESTRICT q8 = y[i].qs;

        for (int j = 0; j < QK_K/32; j += 2) {
            __builtin_prefetch(q2, 0, 1);
            __builtin_prefetch(q8, 0, 1);

            uint32_t aux32[4];
            const uint8_t * aux8 = (const uint8_t *)aux32;

            memcpy(aux32, q2, 4*sizeof(uint32_t));
            q2 += 8;

            vector signed long long aux64x2_0 = {*(const int64_t *)(iq2xxs_grid + aux8[ 0]), *(const int64_t *)(iq2xxs_grid + aux8[ 1])};
            vector signed long long aux64x2_1 = {*(const int64_t *)(iq2xxs_grid + aux8[ 2]), *(const int64_t *)(iq2xxs_grid + aux8[ 3])};
            vector signed long long aux64x2_2 = {*(const int64_t *)(iq2xxs_grid + aux8[ 8]), *(const int64_t *)(iq2xxs_grid + aux8[ 9])};
            vector signed long long aux64x2_3 = {*(const int64_t *)(iq2xxs_grid + aux8[10]), *(const int64_t *)(iq2xxs_grid + aux8[11])};

            vector signed long long vsigns0 = {*(const int64_t *)(signs64 + ((aux32[1] >>  0) & 127)), *(const int64_t *)(signs64 + ((aux32[1] >>  7) & 127))};
            vector signed long long vsigns1 = {*(const int64_t *)(signs64 + ((aux32[1] >> 14) & 127)), *(const int64_t *)(signs64 + ((aux32[1] >> 21) & 127))};
            vector signed long long vsigns2 = {*(const int64_t *)(signs64 + ((aux32[3] >>  0) & 127)), *(const int64_t *)(signs64 + ((aux32[3] >>  7) & 127))};
            vector signed long long vsigns3 = {*(const int64_t *)(signs64 + ((aux32[3] >> 14) & 127)), *(const int64_t *)(signs64 + ((aux32[3] >> 21) & 127))};

            vector signed char q2x0 = (vector signed char)vec_mul((vector signed char)vsigns0, (vector signed char)aux64x2_0);
            vector signed char q2x1 = (vector signed char)vec_mul((vector signed char)vsigns1, (vector signed char)aux64x2_1);
            vector signed char q2x2 = (vector signed char)vec_mul((vector signed char)vsigns2, (vector signed char)aux64x2_2);
            vector signed char q2x3 = (vector signed char)vec_mul((vector signed char)vsigns3, (vector signed char)aux64x2_3);

            vector signed char q8y0 = vec_xl( 0, q8);
            vector signed char q8y1 = vec_xl(16, q8);
            vector signed char q8y2 = vec_xl(32, q8);
            vector signed char q8y3 = vec_xl(48, q8);
            q8 += 64;

            vector signed short qv0 = vec_add(vec_mule(q2x0, q8y0), vec_mulo(q2x0, q8y0));
            vector signed short qv1 = vec_add(vec_mule(q2x1, q8y1), vec_mulo(q2x1, q8y1));
            vector signed short qv2 = vec_add(vec_mule(q2x2, q8y2), vec_mulo(q2x2, q8y2));
            vector signed short qv3 = vec_add(vec_mule(q2x3, q8y3), vec_mulo(q2x3, q8y3));

            const uint16_t ls0 = aux32[1] >> 28;
            const uint16_t ls1 = aux32[3] >> 28;

            vector signed short vscales01 = vec_splats((int16_t)(2*ls0+1));
            vector signed short vscales23 = vec_splats((int16_t)(2*ls1+1));

            vsumi0 = vec_msum(qv0, vscales01, vsumi0);
            vsumi1 = vec_msum(qv1, vscales01, vsumi1);
            vsumi2 = vec_msum(qv2, vscales23, vsumi2);
            vsumi3 = vec_msum(qv3, vscales23, vsumi3);
        }

        vsumf0 = vec_madd(vec_ctf(vsumi0, 0), vd, vsumf0);
        vsumf1 = vec_madd(vec_ctf(vsumi1, 0), vd, vsumf1);
        vsumf2 = vec_madd(vec_ctf(vsumi2, 0), vd, vsumf2);
        vsumf3 = vec_madd(vec_ctf(vsumi3, 0), vd, vsumf3);
    }

    vsumf0 = vec_add(vsumf0, vsumf2);
    vsumf1 = vec_add(vsumf1, vsumf3);

    vsumf0 = vec_add(vsumf0, vsumf1);

    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 4));
    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 8));

    *s = 0.125f * vec_extract(vsumf0, 0);

#elif defined(__loongarch_asx)

    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    uint32_t aux32[4];
    const uint8_t * aux8 = (const uint8_t *)aux32;

    __m256 accumf = (__m256)__lasx_xvldi(0);
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint16_t * GGML_RESTRICT q2 = x[i].qs;
        const int8_t   * GGML_RESTRICT q8 = y[i].qs;
        __m256i sumi1 = __lasx_xvldi(0);
        __m256i sumi2 = __lasx_xvldi(0);
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m256i q8_1 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            const __m256i q8_2 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            memcpy(aux32, q2, 4*sizeof(uint32_t)); q2 += 8;

            const __m256i q2_1 = lasx_set_d(iq2xxs_grid[aux8[ 3]], iq2xxs_grid[aux8[ 2]], iq2xxs_grid[aux8[1]], iq2xxs_grid[aux8[0]]);
            const __m256i q2_2 = lasx_set_d(iq2xxs_grid[aux8[11]], iq2xxs_grid[aux8[10]], iq2xxs_grid[aux8[9]], iq2xxs_grid[aux8[8]]);
            const __m256i s2_1 = lasx_set_d(signs64[(aux32[1] >> 21) & 127], signs64[(aux32[1] >> 14) & 127],
                                                   signs64[(aux32[1] >>  7) & 127], signs64[(aux32[1] >>  0) & 127]);
            const __m256i s2_2 = lasx_set_d(signs64[(aux32[3] >> 21) & 127], signs64[(aux32[3] >> 14) & 127],
                                                   signs64[(aux32[3] >>  7) & 127], signs64[(aux32[3] >>  0) & 127]);
            const __m256i q8s_1 = __lasx_xvsigncov_b(s2_1, q8_1);
            const __m256i q8s_2 = __lasx_xvsigncov_b(s2_2, q8_2);
            const __m256i dot1  = lasx_maddubs_h(q2_1, q8s_1);
            const __m256i dot2  = lasx_maddubs_h(q2_2, q8s_2);
            const uint16_t ls1 = aux32[1] >> 28;
            const uint16_t ls2 = aux32[3] >> 28;
            const __m256i p1 = lasx_madd_h(dot1, __lasx_xvreplgr2vr_h(2*ls1+1));
            const __m256i p2 = lasx_madd_h(dot2, __lasx_xvreplgr2vr_h(2*ls2+1));
            sumi1 = __lasx_xvadd_w(sumi1, p1);
            sumi2 = __lasx_xvadd_w(sumi2, p2);
        }

        accumf = __lasx_xvfmadd_s(__lasx_xvreplfr2vr_s(d), __lasx_xvffint_s_w(__lasx_xvadd_w(sumi1, sumi2)), accumf);
    }

    *s = 0.125f * hsum_float_8(accumf);
//#elif defined(__VXE__) || defined(__VXE2__)
//    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;
//
//    uint32_t aux32[4];
//    const uint8_t * aux8 = (const uint8_t *)aux32;
//
//    float sumf = 0;
//
//    for (int i = 0; i < nb; ++i) {
//        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
//        const uint16_t * GGML_RESTRICT q2 = x[i].qs;
//        const int8_t   * GGML_RESTRICT q8 = y[i].qs;
//
//        float sumf1 = 0, sumf2 = 0;
//
//        for (int ib32 = 0; ib32 < QK_K/32; ib += 2) {
//            int8x16_t q8b0 = vec_xl( 0, q8);
//            int8x16_t qb81 = vec_xl(16, q8);
//            int8x16_t q8b2 = vec_xl(32, q8);
//            int8x16_t q8b3 = vec_xl(48, q8);
//            q8 += 64;
//
//            memcpy(aux32, q2, 4 * sizeof(uint32_t));
//            q2 += 8;
//
//            int8x16_t q2u0 = { *(const int64_t *)(iq2xxs_grid + aux8[ 0]), *(const int64_t *)(iq2xxs_grid + aux8[ 1]) };
//            int8x16_t q2u1 = { *(const int64_t *)(iq2xxs_grid + aux8[ 2]), *(const int64_t *)(iq2xxs_grid + aux8[ 3]) };
//            int8x16_t q2u2 = { *(const int64_t *)(iq2xxs_grid + aux8[ 8]), *(const int64_t *)(iq2xxs_grid + aux8[ 9]) };
//            int8x16_t q2u3 = { *(const int64_t *)(iq2xxs_grid + aux8[10]), *(const int64_t *)(iq2xxs_grid + aux8[11]) };
//
//            int8x16_t q2s0 = { *(const int64_t *)(signs64 + ((aux32[1] >>  0) & 127)), *(const int64_t *)(signs64 + ((aux32[1] >>  7) & 127)) };
//            int8x16_t q2s1 = { *(const int64_t *)(signs64 + ((aux32[1] >> 14) & 127)), *(const int64_t *)(signs64 + ((aux32[1] >> 21) & 127)) };
//            int8x16_t q2s2 = { *(const int64_t *)(signs64 + ((aux32[3] >>  0) & 127)), *(const int64_t *)(signs64 + ((aux32[3] >>  7) & 127)) };
//            int8x16_t q2s3 = { *(const int64_t *)(signs64 + ((aux32[3] >> 14) & 127)), *(const int64_t *)(signs64 + ((aux32[3] >> 21) & 127)) };
//
//            q2u0 = vec_mul(q2u0, q2s0);
//            q2u1 = vec_mul(q2u1, q2s1);
//            q2u2 = vec_mul(q2u2, q2s2);
//            q2u3 = vec_mul(q2u3, q2s3);
//
//            const int32x4_t p1 = ggml_vec_dot(ggml_vec_dot(vec_splat_s32(0), q2u0, q8b0), q2u1, q8b1);
//            const int32x4_t p2 = ggml_vec_dot(ggml_vec_dot(vec_splat_s32(0), q2u2, q8b2), q2u3, q8b3);
//
//            sumf1 += (p1[0] + p1[1] + p1[2] + p1[3]) * (0.5f + (aux32[1] >> 28));
//            sumf2 += (p2[0] + p2[1] + p2[2] + p2[3]) * (0.5f + (aux32[3] >> 28));
//        }
//
//        sumf += d * (sumf1 + sumf2);
//    }
//
//    *s = 0.25f * sumf;
#else

    uint32_t aux32[2];
    const uint8_t * aux8 = (const uint8_t *)aux32;

    float sumf = 0.f;
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint16_t * GGML_RESTRICT q2 = x[i].qs;
        const int8_t   * GGML_RESTRICT q8 = y[i].qs;
        int32_t bsum = 0;
        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            memcpy(aux32, q2, 2*sizeof(uint32_t));
            q2 += 4;
            const uint32_t ls = 2*(aux32[1] >> 28) + 1;
            int32_t sumi = 0;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2xxs_grid + aux8[l]);
                const uint8_t  signs = ksigns_iq2xs[(aux32[1] >> 7*l) & 127];
                for (int j = 0; j < 8; ++j) {
                    sumi += grid[j] * q8[j] * (signs & kmask_iq2xs[j] ? -1 : 1);
                }
                q8 += 8;
            }
            bsum += sumi * ls;
        }
        sumf += d * bsum;
    }
    *s = 0.125f * sumf;
#endif
}